

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  iterator ellipses_begin;
  iterator ellipses_end;
  size_type sVar1;
  size_type sVar2;
  iterator __first;
  iterator __last;
  iterator __result;
  ostream *poVar3;
  reference pvVar4;
  int in_R8D;
  ulong local_648;
  size_t i;
  allocator<unsigned_long> local_611;
  undefined1 local_610 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> arrow_point;
  arrows_position arrows_found;
  array<cv::Mat,_10UL> target_ring_mask;
  array<cv::RotatedRect,_10UL> target_ellipses;
  _InputArray local_128;
  Mat local_110 [8];
  Mat image_test_gray;
  allocator<char> local_99;
  string local_98 [32];
  string local_78 [8];
  Mat image_test;
  int local_6c;
  long local_68;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Surrog[P]ArcheryCounter/Images/\\20190325_204137.jpg"
             ,&local_99);
  cv::imread(local_78,(int)local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  if (local_68 == 0) {
    printf("No image data\n");
    argv_local._4_4_ = -1;
  }
  else {
    cv::Mat::Mat(local_110);
    cv::_InputArray::_InputArray(&local_128,(Mat *)local_78);
    cv::_OutputArray::_OutputArray
              ((_OutputArray *)&target_ellipses._M_elems[9].size.height,local_110);
    cv::cvtColor((cv *)&local_128,(_InputArray *)&target_ellipses._M_elems[9].size.height,
                 (_OutputArray *)0x6,0,in_R8D);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&target_ellipses._M_elems[9].size.height);
    cv::_InputArray::~_InputArray(&local_128);
    ellipses::find_target
              ((array<cv::RotatedRect,_10UL> *)&target_ring_mask.field_0x3b8,(Mat *)local_78,false);
    compute_target_ring_mask
              ((array<cv::Mat,_10UL> *)
               &arrows_found.fletching.
                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (array<cv::RotatedRect,_10UL> *)&target_ring_mask.field_0x3b8,_image_test,local_6c,
               false);
    NN::find_arrows((arrows_position *)
                    &arrow_point.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Mat *)local_78,local_110,
                    (array<cv::Mat,_10UL> *)
                    &arrows_found.fletching.
                     super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    ellipses_begin =
         std::array<cv::RotatedRect,_10UL>::begin
                   ((array<cv::RotatedRect,_10UL> *)&target_ring_mask.field_0x3b8);
    ellipses_end = std::array<cv::RotatedRect,_10UL>::end
                             ((array<cv::RotatedRect,_10UL> *)&target_ring_mask.field_0x3b8);
    ellipses::display_ellipses<cv::RotatedRect*>((Mat *)local_78,ellipses_begin,ellipses_end);
    sVar1 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                      ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                       &arrow_point.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    sVar2 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                      ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                       &arrows_found.tip.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar1 != sVar2) {
      __assert_fail("arrows_found.tip.size() == arrows_found.fletching.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Surrog[P]ArcheryCounter/main.cpp"
                    ,0x53,"int main(int, char **)");
    }
    sVar1 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                      ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                       &arrow_point.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    std::allocator<unsigned_long>::allocator(&local_611);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_610,sVar1,&local_611);
    std::allocator<unsigned_long>::~allocator(&local_611);
    this = &arrow_point.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    __first = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::begin
                        ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this);
    __last = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::end
                       ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this);
    __result = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_610);
    std::
    transform<__gnu_cxx::__normal_iterator<cv::Point_<int>*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,main::__0>
              ((__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                )__first._M_current,
               (__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                )__last._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__result._M_current,
               (anon_class_8_1_2cfef4eb)
               &arrows_found.fletching.
                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_648 = 0;
    while( true ) {
      sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_610);
      if (sVar1 <= local_648) break;
      poVar3 = std::operator<<((ostream *)&std::cout,"arrow ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_648);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_610,
                          local_648);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
      std::operator<<(poVar3,'\n');
      local_648 = local_648 + 1;
    }
    argv_local._4_4_ = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_610);
    NN::arrows_position::~arrows_position
              ((arrows_position *)
               &arrow_point.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::array<cv::Mat,_10UL>::~array
              ((array<cv::Mat,_10UL> *)
               &arrows_found.fletching.
                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    cv::Mat::~Mat(local_110);
  }
  cv::Mat::~Mat((Mat *)local_78);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    cv::Mat image_test = cv::imread(test, cv::IMREAD_COLOR);

    if(!image_test.data)
    {
        printf("No image data\n");
        return -1;
    }

    cv::Mat image_test_gray;
    cv::cvtColor(image_test, image_test_gray, cv::COLOR_BGR2GRAY);

    std::array<cv::RotatedRect, 10> target_ellipses = ellipses::find_target(image_test, false);

    std::array<cv::Mat, 10> target_ring_mask
        = compute_target_ring_mask(target_ellipses, image_test.rows, image_test.cols);

    auto arrows_found = NN::find_arrows(image_test, image_test_gray, target_ring_mask);

    ellipses::display_ellipses(image_test, target_ellipses.begin(), target_ellipses.end());

    assert(arrows_found.tip.size() == arrows_found.fletching.size());

    std::vector<std::size_t> arrow_point(arrows_found.tip.size());
    std::transform(arrows_found.tip.begin(), arrows_found.tip.end(), arrow_point.begin(),
        [&target_ring_mask](const cv::Point& tip_pos) { return get_arrow_point(tip_pos, target_ring_mask); });

	for(std::size_t i = 0; i < arrow_point.size();                                                                       i++)
    {
        std::cout << "arrow " << i << arrow_point[i] << '\n';
    }

    return 0;
}